

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

void __thiscall Epoll::epoll_add(Epoll *this,SP_Channel *request,int timeout)

{
  element_type *peVar1;
  int __fd;
  int iVar2;
  epoll_event event;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __fd = Channel::getFd((request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (0 < timeout) {
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
    add_time(this,(shared_ptr<Channel> *)&local_40,timeout);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> *)&event,
               &((request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->holder_
              );
    std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this->fd2http_[__fd].super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> *)&event);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&event.data + 4));
  }
  peVar1 = (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  event.events = peVar1->events_;
  peVar1->lastEvents_ = event.events;
  event.data.fd = __fd;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this->fd2chan_[__fd].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>,
             &request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = epoll_ctl(this->epollFd_,1,__fd,(epoll_event *)&event);
  if (iVar2 < 0) {
    perror("epoll_add error");
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this->fd2chan_[__fd].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void Epoll::epoll_add(SP_Channel request, int timeout){
    int fd = request->getFd();
    if(timeout>0){
        add_time(request, timeout);
        fd2http_[fd] = request->getHolder();
    }
    struct epoll_event event;
    event.data.fd=fd;
    event.events=request->getEvents();

    request->EqualAndUpdateLastEvents();

    fd2chan_[fd] = request;
    if(epoll_ctl(epollFd_, EPOLL_CTL_ADD, fd, &event)<0){
        perror("epoll_add error");
        fd2chan_[fd].reset();
    }
}